

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void repeat_high_4pixels(__m128i *x,__m128i *row)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i *row_local;
  __m128i *x_local;
  undefined4 uStack_30;
  undefined4 uStack_20;
  undefined4 uStack_10;
  
  auVar1 = pshufhw((undefined1  [16])*x,(undefined1  [16])*x,0);
  auVar2 = pshufhw((undefined1  [16])*x,(undefined1  [16])*x,0x55);
  auVar3 = pshufhw((undefined1  [16])*x,(undefined1  [16])*x,0xaa);
  auVar4 = pshufhw((undefined1  [16])*x,(undefined1  [16])*x,0xff);
  uStack_9c = auVar1._12_4_;
  *(undefined4 *)(*row + 1) = uStack_10;
  *(undefined4 *)((long)*row + 0xc) = uStack_9c;
  (*row)[1] = CONCAT44(uStack_9c,uStack_20);
  uStack_ac = auVar2._12_4_;
  *(undefined4 *)(row[1] + 1) = uStack_30;
  *(undefined4 *)((long)row[1] + 0xc) = uStack_ac;
  row[1][1] = CONCAT44(uStack_ac,row_local._0_4_);
  uStack_bc = auVar3._12_4_;
  *(undefined4 *)(row[2] + 1) = (undefined4)u0[0];
  *(undefined4 *)((long)row[2] + 0xc) = uStack_bc;
  row[2][1] = CONCAT44(uStack_bc,(undefined4)u1[0]);
  uStack_cc = auVar4._12_4_;
  *(undefined4 *)(row[3] + 1) = (undefined4)u2[0];
  *(undefined4 *)((long)row[3] + 0xc) = uStack_cc;
  row[3][1] = CONCAT44(uStack_cc,(undefined4)u3[0]);
  return;
}

Assistant:

static inline void repeat_high_4pixels(const __m128i *x, __m128i *row) {
  const __m128i u0 = _mm_shufflehi_epi16(*x, 0);
  const __m128i u1 = _mm_shufflehi_epi16(*x, 0x55);
  const __m128i u2 = _mm_shufflehi_epi16(*x, 0xaa);
  const __m128i u3 = _mm_shufflehi_epi16(*x, 0xff);

  row[0] = _mm_unpackhi_epi64(u0, u0);
  row[1] = _mm_unpackhi_epi64(u1, u1);
  row[2] = _mm_unpackhi_epi64(u2, u2);
  row[3] = _mm_unpackhi_epi64(u3, u3);
}